

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

uchar * LoadFileToMemory(char *file_path,size_t *file_size)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  uchar *__ptr;
  size_t sVar2;
  
  __stream = fopen(file_path,"rb");
  if (__stream != (FILE *)0x0) {
    iVar1 = fseek(__stream,0,2);
    if ((iVar1 == 0) && (__size = ftell(__stream), -1 < (long)__size)) {
      rewind(__stream);
      __ptr = (uchar *)malloc(__size);
      if (__ptr != (uchar *)0x0) {
        sVar2 = fread(__ptr,__size,1,__stream);
        if (sVar2 == 1) {
          fclose(__stream);
          *file_size = __size;
          return __ptr;
        }
        free(__ptr);
      }
    }
    fclose(__stream);
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char* LoadFileToMemory(const char *file_path, size_t *file_size)
{
	unsigned char *buffer = NULL;

	FILE *file = fopen(file_path, "rb");

	if (file != NULL)
	{
		if (!fseek(file, 0, SEEK_END))
		{
			const long _file_size = ftell(file);

			if (_file_size >= 0)
			{
				rewind(file);
				buffer = (unsigned char*)malloc(_file_size);

				if (buffer != NULL)
				{
					if (fread(buffer, _file_size, 1, file) == 1)
					{
						fclose(file);
						*file_size = (size_t)_file_size;
						return buffer;
					}

					free(buffer);
				}
			}
		}

		fclose(file);
	}

	return NULL;
}